

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O0

void output_conll(vector<unsigned_int,_std::allocator<unsigned_int>_> *sentence,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *pos,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *sentenceUnkStrings,
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *intToWords,
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *intToPos,
                 map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *hyp,
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *rel_hyp)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference pvVar7;
  long lVar8;
  pointer ppVar9;
  pointer ppVar10;
  ostream *poVar11;
  pointer ppVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  char cVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  size_t last_char_in_rel;
  size_t first_char_in_rel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hyp_rel;
  const_iterator hyp_rel_it;
  int hyp_head;
  const_iterator pit;
  string wit;
  uint index;
  uint i;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd48;
  ostream *in_stack_fffffffffffffd58;
  Corpus *in_stack_fffffffffffffd60;
  string *local_1d0;
  bool local_1b1;
  bool local_199;
  bool local_179;
  string local_170 [32];
  long local_150;
  long local_148;
  string local_140 [32];
  _Self local_120;
  uint local_114;
  _Self local_110;
  uint local_104;
  _Base_ptr local_100;
  int local_f4;
  _Self local_f0;
  uint local_e4;
  _Self local_e0;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  string local_c8 [32];
  _Self local_a8;
  _Self local_a0;
  byte local_93;
  byte local_92;
  allocator local_91;
  string local_90 [35];
  byte local_6d;
  byte local_5a;
  allocator local_59;
  string local_58 [32];
  uint local_38;
  uint local_34;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  
  local_34 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    uVar5 = (ulong)local_34;
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
    if (sVar6 - 1 <= uVar5) {
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      return;
    }
    local_38 = local_34 + 1;
    uVar5 = (ulong)local_34;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_18);
    local_5a = 0;
    local_6d = 0;
    local_92 = 0;
    local_93 = 0;
    local_179 = false;
    if (uVar5 < sVar6) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_8,(ulong)local_34);
      uVar1 = *pvVar7;
      std::allocator<char>::allocator();
      local_5a = 1;
      std::__cxx11::string::string(local_58,"UNK",&local_59);
      local_6d = 1;
      uVar3 = cpyp::Corpus::get_or_add_word
                        (in_stack_fffffffffffffd60,(string *)in_stack_fffffffffffffd58);
      if (uVar1 == uVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_18,(ulong)local_34);
        lVar8 = std::__cxx11::string::size();
        local_199 = true;
        if (lVar8 == 0) goto LAB_004849fd;
      }
      else {
LAB_004849fd:
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (local_8,(ulong)local_34);
        uVar1 = *pvVar7;
        std::allocator<char>::allocator();
        local_92 = 1;
        std::__cxx11::string::string(local_90,"UNK",&local_91);
        local_93 = 1;
        uVar3 = cpyp::Corpus::get_or_add_word
                          (in_stack_fffffffffffffd60,(string *)in_stack_fffffffffffffd58);
        local_1b1 = false;
        if (uVar1 != uVar3) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_18,(ulong)local_34);
          lVar8 = std::__cxx11::string::size();
          local_1b1 = false;
          if (lVar8 == 0) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      (local_8,(ulong)local_34);
            local_a0._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(in_stack_fffffffffffffd48,(key_type_conflict *)0x484b05);
            local_a8._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(in_stack_fffffffffffffd48);
            local_1b1 = std::operator!=(&local_a0,&local_a8);
          }
        }
        local_199 = local_1b1;
      }
      local_179 = local_199;
    }
    if (local_179 == false) {
      __assert_fail("i < sentenceUnkStrings.size() && ((sentence[i] == corpus.get_or_add_word(cpyp::Corpus::UNK) && sentenceUnkStrings[i].size() > 0) || (sentence[i] != corpus.get_or_add_word(cpyp::Corpus::UNK) && sentenceUnkStrings[i].size() == 0 && intToWords.find(sentence[i]) != intToWords.end()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                    ,0x36a,
                    "void output_conll(const vector<unsigned int> &, const vector<unsigned int> &, const vector<string> &, const map<unsigned int, string> &, const map<unsigned int, string> &, const map<int, int> &, const map<int, string> &)"
                   );
    }
    if ((local_93 & 1) != 0) {
      std::__cxx11::string::~string(local_90);
    }
    if ((local_92 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    if ((local_6d & 1) != 0) {
      std::__cxx11::string::~string(local_58);
    }
    if ((local_5a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,(ulong)local_34);
    lVar8 = std::__cxx11::string::size();
    if (lVar8 == 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_8,(ulong)local_34);
      local_d0 = (_Base_ptr)
                 std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(in_stack_fffffffffffffd48,(key_type_conflict *)0x484ced);
      ppVar12 = std::
                _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x484d02);
      local_1d0 = (string *)&ppVar12->second;
    }
    else {
      local_1d0 = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](local_18,(ulong)local_34);
    }
    std::__cxx11::string::string(local_c8,local_1d0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_10,(ulong)local_34);
    local_d8 = (_Base_ptr)
               std::
               map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(in_stack_fffffffffffffd48,(key_type_conflict *)0x484d59);
    local_e4 = local_34;
    local_e0._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                   ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    in_stack_fffffffffffffd48,(key_type *)0x484d96);
    local_f0._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    in_stack_fffffffffffffd48);
    bVar2 = std::operator!=(&local_e0,&local_f0);
    if (!bVar2) {
      __assert_fail("hyp.find(i) != hyp.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                    ,0x36e,
                    "void output_conll(const vector<unsigned int> &, const vector<unsigned int> &, const vector<string> &, const map<unsigned int, string> &, const map<unsigned int, string> &, const map<int, int> &, const map<int, string> &)"
                   );
    }
    local_104 = local_34;
    local_100 = (_Base_ptr)
                std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                find((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     in_stack_fffffffffffffd48,(key_type *)0x484ea3);
    ppVar9 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)0x484eca);
    iVar4 = ppVar9->second + 1;
    local_f4 = iVar4;
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
    if (iVar4 == (int)sVar6) {
      local_f4 = 0;
    }
    local_114 = local_34;
    local_110._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffd48,(key_type *)0x484f2e);
    local_120._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffd48);
    bVar2 = std::operator!=(&local_110,&local_120);
    if (!bVar2) {
      __assert_fail("hyp_rel_it != rel_hyp.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                    ,0x372,
                    "void output_conll(const vector<unsigned int> &, const vector<unsigned int> &, const vector<string> &, const map<unsigned int, string> &, const map<unsigned int, string> &, const map<int, int> &, const map<int, string> &)"
                   );
    }
    ppVar10 = std::
              _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator->((_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)0x484fa6);
    std::__cxx11::string::string(local_140,(string *)&ppVar10->second);
    cVar13 = (char)local_140;
    local_148 = std::__cxx11::string::find(cVar13,0x28);
    local_148 = local_148 + 1;
    local_150 = std::__cxx11::string::rfind(cVar13,0x29);
    local_150 = local_150 + -1;
    std::__cxx11::string::substr((ulong)local_170,(ulong)local_140);
    std::__cxx11::string::operator=(local_140,local_170);
    std::__cxx11::string::~string(local_170);
    poVar11 = (ostream *)std::ostream::operator<<(&std::cout,local_38);
    poVar11 = std::operator<<(poVar11,'\t');
    poVar11 = std::operator<<(poVar11,local_c8);
    poVar11 = std::operator<<(poVar11,'\t');
    poVar11 = std::operator<<(poVar11,"_");
    poVar11 = std::operator<<(poVar11,'\t');
    poVar11 = std::operator<<(poVar11,"_");
    poVar11 = std::operator<<(poVar11,'\t');
    ppVar12 = std::
              _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)0x485140);
    poVar11 = std::operator<<(poVar11,(string *)&ppVar12->second);
    poVar11 = std::operator<<(poVar11,'\t');
    poVar11 = std::operator<<(poVar11,"_");
    poVar11 = std::operator<<(poVar11,'\t');
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_f4);
    poVar11 = std::operator<<(poVar11,'\t');
    poVar11 = std::operator<<(poVar11,local_140);
    poVar11 = std::operator<<(poVar11,'\t');
    in_stack_fffffffffffffd60 = (Corpus *)std::operator<<(poVar11,"_");
    in_stack_fffffffffffffd58 = std::operator<<((ostream *)in_stack_fffffffffffffd60,'\t');
    poVar11 = std::operator<<(in_stack_fffffffffffffd58,"_");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_c8);
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void output_conll(const vector<unsigned>& sentence, const vector<unsigned>& pos,
                  const vector<string>& sentenceUnkStrings, 
                  const map<unsigned, string>& intToWords, 
                  const map<unsigned, string>& intToPos, 
                  const map<int,int>& hyp, const map<int,string>& rel_hyp) {
  for (unsigned i = 0; i < (sentence.size()-1); ++i) {
    auto index = i + 1;
    assert(i < sentenceUnkStrings.size() && 
           ((sentence[i] == corpus.get_or_add_word(cpyp::Corpus::UNK) &&
             sentenceUnkStrings[i].size() > 0) ||
            (sentence[i] != corpus.get_or_add_word(cpyp::Corpus::UNK) &&
             sentenceUnkStrings[i].size() == 0 &&
             intToWords.find(sentence[i]) != intToWords.end())));
    string wit = (sentenceUnkStrings[i].size() > 0)? 
      sentenceUnkStrings[i] : intToWords.find(sentence[i])->second;
    auto pit = intToPos.find(pos[i]);
    assert(hyp.find(i) != hyp.end());
    auto hyp_head = hyp.find(i)->second + 1;
    if (hyp_head == (int)sentence.size()) hyp_head = 0;
    auto hyp_rel_it = rel_hyp.find(i);
    assert(hyp_rel_it != rel_hyp.end());
    auto hyp_rel = hyp_rel_it->second;
    size_t first_char_in_rel = hyp_rel.find('(') + 1;
    size_t last_char_in_rel = hyp_rel.rfind(')') - 1;
    hyp_rel = hyp_rel.substr(first_char_in_rel, last_char_in_rel - first_char_in_rel + 1);
    cout << index << '\t'       // 1. ID 
         << wit << '\t'         // 2. FORM
         << "_" << '\t'         // 3. LEMMA 
         << "_" << '\t'         // 4. CPOSTAG 
         << pit->second << '\t' // 5. POSTAG
         << "_" << '\t'         // 6. FEATS
         << hyp_head << '\t'    // 7. HEAD
         << hyp_rel << '\t'     // 8. DEPREL
         << "_" << '\t'         // 9. PHEAD
         << "_" << endl;        // 10. PDEPREL
  }
  cout << endl;
}